

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_find(_glist *x,t_symbol *s,t_floatarg wholeword)

{
  char *__s;
  _instanceeditor *p_Var1;
  uint uVar2;
  t_symbol *ptVar3;
  _binbuf *x_00;
  size_t size;
  ulong uVar4;
  int myindex;
  undefined8 local_28;
  
  local_28 = (ulong)(uint)wholeword << 0x20;
  ptVar3 = sys_decodedialog(s);
  x_00 = *(_binbuf **)((pd_maininstance.pd_gui)->i_editor + 0x60);
  if (x_00 == (_binbuf *)0x0) {
    x_00 = binbuf_new();
    *(_binbuf **)((pd_maininstance.pd_gui)->i_editor + 0x60) = x_00;
  }
  __s = ptVar3->s_name;
  size = strlen(__s);
  binbuf_text(x_00,__s,size);
  p_Var1 = (pd_maininstance.pd_gui)->i_editor;
  *(undefined4 *)(p_Var1 + 0x58) = 0;
  *(int *)(p_Var1 + 0x5c) = (int)local_28._4_4_;
  canvas_whichfind = x;
  uVar2 = canvas_dofind(x,(int *)&local_28);
  if (uVar2 == 0) {
    uVar4 = (ulong)*(uint *)((pd_maininstance.pd_gui)->i_editor + 0x58);
  }
  else {
    *(undefined4 *)((pd_maininstance.pd_gui)->i_editor + 0x58) = 1;
    uVar4 = 1;
  }
  pdgui_vmess("pdtk_showfindresult","^ iii",x,(ulong)uVar2,uVar4,local_28 & 0xffffffff);
  return;
}

Assistant:

static void canvas_find(t_canvas *x, t_symbol *s, t_floatarg wholeword)
{
    int myindex = 0, found;
    t_symbol *decodedsym = sys_decodedialog(s);
    if (!EDITOR->canvas_findbuf)
        EDITOR->canvas_findbuf = binbuf_new();
    binbuf_text(EDITOR->canvas_findbuf, decodedsym->s_name,
        strlen(decodedsym->s_name));
    EDITOR->canvas_find_index = 0;
    EDITOR->canvas_find_wholeword = wholeword;
    canvas_whichfind = x;
    found = canvas_dofind(x, &myindex);
    if (found)
        EDITOR->canvas_find_index = 1;
    pdgui_vmess("pdtk_showfindresult", "^ iii",
        x,
        found, EDITOR->canvas_find_index, myindex);
}